

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTextDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *text_dir)

{
  int iVar1;
  ON_2dPoint *pOVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ON_2dVector OVar7;
  
  iVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (iVar1 < 2) {
    ON_2dVector::Set(text_dir,-1.0,0.0);
    bVar4 = false;
  }
  else {
    uVar6 = (ulong)(iVar1 - 1);
    uVar5 = uVar6 + 1;
    lVar3 = uVar6 * 0x10;
    do {
      pOVar2 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      OVar7 = ON_2dPoint::operator-(pOVar2 + uVar6,(ON_2dPoint *)((long)&pOVar2[-1].x + lVar3));
      *text_dir = OVar7;
      bVar4 = ON_2dVector::Unitize(text_dir);
      if (bVar4) {
        return bVar4;
      }
      ON_2dVector::Set(text_dir,-1.0,0.0);
      uVar5 = uVar5 - 1;
      lVar3 = lVar3 + -0x10;
    } while (1 < uVar5);
  }
  return bVar4;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTextDirection( ON_2dVector& text_dir ) const 
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    text_dir.Set(-1.0,0.0);
  }
  else
  {
    int i; // 20 June 2011 Fixed textdir for leaders with 2 points. rr86801
    for(i = point_count-1; i >= 1; i--)
    {
      text_dir = m_points[point_count-1] -  m_points[i-1];
      if(text_dir.Unitize())
      {
        rc = true;
        break;
      }
      text_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}